

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock.c
# Opt level: O0

void mmk_mock_reset_call(char *file,int line)

{
  uint uVar1;
  long *in_FS_OFFSET;
  uint val;
  int line_local;
  char *file_local;
  
  uVar1 = *(uint *)(*in_FS_OFFSET + -0x28);
  if (uVar1 == 0) {
    mmk_panic("mimick: %s:%d: mocked function was never called -- was it optimized away?\n",file,
              (ulong)(uint)line);
  }
  if (1 < uVar1) {
    mmk_panic("mimick: %s:%d: mocked function was called more than once (exactly %u times) in the call expression.\n"
              ,file,(ulong)(uint)line,(ulong)uVar1);
  }
  *(undefined4 *)(*in_FS_OFFSET + -0x28) = 0;
  return;
}

Assistant:

void mmk_mock_reset_call(const char *file, int line)
{
    unsigned val = tls_get(unsigned, mock_called);
    if (!val) {
        mmk_panic("mimick: %s:%d: mocked function was never called "
                  "-- was it optimized away?\n", file, line);
    }
    if (val > 1) {
        mmk_panic("mimick: %s:%d: mocked function was called more than once "
                  "(exactly %u times) in the call expression.\n",
                  file, line, val);
    }
    tls_set(unsigned, mock_called, 0);
}